

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::LanguageString(uint Language)

{
  undefined1 auStack_18 [4];
  uint Language_local;
  
  if (Language == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C89");
  }
  else if (Language == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C");
  }
  else if (Language == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Ada83");
  }
  else if (Language == 4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C_plus_plus");
  }
  else if (Language == 5) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Cobol74");
  }
  else if (Language == 6) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Cobol85");
  }
  else if (Language == 7) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Fortran77");
  }
  else if (Language == 8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Fortran90");
  }
  else if (Language == 9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Pascal83");
  }
  else if (Language == 10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Modula2");
  }
  else if (Language == 0xb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Java");
  }
  else if (Language == 0xc) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C99");
  }
  else if (Language == 0xd) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Ada95");
  }
  else if (Language == 0xe) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Fortran95");
  }
  else if (Language == 0xf) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_PLI");
  }
  else if (Language == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_ObjC");
  }
  else if (Language == 0x11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_ObjC_plus_plus");
  }
  else if (Language == 0x12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_UPC");
  }
  else if (Language == 0x13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_D");
  }
  else if (Language == 0x14) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Python");
  }
  else if (Language == 0x15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_OpenCL");
  }
  else if (Language == 0x16) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Go");
  }
  else if (Language == 0x17) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Modula3");
  }
  else if (Language == 0x18) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Haskell");
  }
  else if (Language == 0x19) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C_plus_plus_03");
  }
  else if (Language == 0x1a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C_plus_plus_11");
  }
  else if (Language == 0x1b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_OCaml");
  }
  else if (Language == 0x1c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Rust");
  }
  else if (Language == 0x1d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C11");
  }
  else if (Language == 0x1e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Swift");
  }
  else if (Language == 0x1f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Julia");
  }
  else if (Language == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Dylan");
  }
  else if (Language == 0x21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_C_plus_plus_14");
  }
  else if (Language == 0x22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Fortran03");
  }
  else if (Language == 0x23) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Fortran08");
  }
  else if (Language == 0x24) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_RenderScript");
  }
  else if (Language == 0x25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_BLISS");
  }
  else if (Language == 0x8001) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_Mips_Assembler");
  }
  else if (Language == 0x8e57) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_GOOGLE_RenderScript");
  }
  else if (Language == 0xb000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_LANG_BORLAND_Delphi");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::LanguageString(unsigned Language) {
  switch (Language) {
  default:
    return StringRef();
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return "DW_LANG_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}